

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysutil.c
# Opt level: O2

int read_timeout(int fd,uint wait_seconds)

{
  uint __i;
  int iVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  timeval timeout;
  fd_set read_fdset;
  
  if (wait_seconds == 0) {
    return 0;
  }
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    read_fdset.__fds_bits[lVar3] = 0;
  }
  read_fdset.__fds_bits[fd / 0x40] = read_fdset.__fds_bits[fd / 0x40] | 1L << ((byte)fd & 0x3f);
  timeout.tv_sec = (__time_t)wait_seconds;
  timeout.tv_usec = 0;
  do {
    iVar1 = select(fd + 1,(fd_set *)&read_fdset,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&timeout);
    if (-1 < iVar1) {
      if (iVar1 == 0) {
        piVar4 = __errno_location();
        *piVar4 = 0x6e;
        return -1;
      }
      break;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  iVar2 = 0;
  if (iVar1 != 1) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

int read_timeout(int fd, unsigned int wait_seconds) {
  int ret = 0;
  if (wait_seconds > 0) {
    fd_set read_fdset;
    struct timeval timeout;

    FD_ZERO(&read_fdset);
    FD_SET(fd, &read_fdset);

    timeout.tv_sec = wait_seconds;
    timeout.tv_usec = 0;
    do {
      ret = select(fd + 1, &read_fdset, NULL, NULL, &timeout);
    } while (ret < 0 && errno == EINTR);

    if (ret == 0) {
      ret = -1;
      errno = ETIMEDOUT;
    } else if (ret == 1)
      ret = 0;
  }

  return ret;
}